

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GridAxisRegular::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridAxisRegular *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Grid Axis Regular:");
  std::operator<<(poVar1,"\n\tDomain Initial Xi:   ");
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64DomainInitialXi);
  std::operator<<(poVar1,"\n\tDomain Final Xi:     ");
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64DomainFinalXi);
  poVar1 = std::operator<<(poVar1,"\n\tDomain Points Xi:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16DomainPointsXi);
  poVar1 = std::operator<<(poVar1,"\n\tInterleaf Factor:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8InterleafFactor);
  poVar1 = std::operator<<(poVar1,"\n\tAxis Type:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8AxisType);
  poVar1 = std::operator<<(poVar1,"\n\tNumber Of Points:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumPoints);
  poVar1 = std::operator<<(poVar1,"\n\tInitial Index:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16InitialIndex);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString GridAxisRegular::GetAsString() const
{
    KStringStream ss;

    ss << "Grid Axis Regular:"
       << "\n\tDomain Initial Xi:   " << m_f64DomainInitialXi
       << "\n\tDomain Final Xi:     " << m_f64DomainFinalXi
       << "\n\tDomain Points Xi:    " << m_ui16DomainPointsXi
       << "\n\tInterleaf Factor:    " << ( KUINT16 )m_ui8InterleafFactor
       << "\n\tAxis Type:           " << ( KUINT16 )m_ui8AxisType
       << "\n\tNumber Of Points:    " << m_ui16NumPoints
       << "\n\tInitial Index:       " << m_ui16InitialIndex
       << "\n";

    return ss.str();
}